

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qshaderdescription.cpp
# Opt level: O0

QJsonObject * inOutObject(InOutVariable *v)

{
  bool bVar1;
  QJsonObject *in_RDI;
  long in_FS_OFFSET;
  undefined1 auVar2 [16];
  QLatin1StringView QVar3;
  BlockVariable *sv;
  QList<QShaderDescription::BlockVariable> *__range2;
  QJsonObject *obj;
  const_iterator __end2;
  const_iterator __begin2;
  QJsonArray arr;
  QJsonObject *pQVar4;
  QLatin1String *local_110;
  undefined1 local_d8 [16];
  QJsonObject local_c8 [8];
  BlockVariable *local_c0;
  const_iterator local_b8;
  const_iterator local_b0;
  undefined1 *local_a8;
  QJsonValueRef local_a0 [16];
  BlockVariable *v_00;
  undefined1 local_80 [24];
  QJsonValue local_68 [24];
  QJsonValue local_50 [24];
  QJsonValue local_38 [24];
  QJsonValue local_20 [24];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  *(undefined1 **)in_RDI = &DAT_aaaaaaaaaaaaaaaa;
  pQVar4 = in_RDI;
  QJsonObject::QJsonObject(in_RDI);
  QString::fromUtf8<void>((QByteArray *)in_RDI);
  QJsonValue::QJsonValue(local_20,(QString *)local_80);
  nameKey();
  auVar2 = QJsonObject::operator[]((QLatin1String *)pQVar4);
  QJsonValueRef::operator=((QJsonValueRef *)&stack0xffffffffffffff70,local_20);
  QJsonValue::~QJsonValue(local_20);
  QString::~QString((QString *)0x6dfd0c);
  QVar3 = typeStr((VariableType)((ulong)pQVar4 >> 0x20));
  local_110 = (QLatin1String *)QVar3.m_size;
  QJsonValue::QJsonValue(local_38,local_110);
  typeKey();
  local_a0 = (QJsonValueRef  [16])QJsonObject::operator[]((QLatin1String *)pQVar4);
  QJsonValueRef::operator=(local_a0,local_38);
  QJsonValue::~QJsonValue(local_38);
  v_00 = auVar2._8_8_;
  addDeco((QJsonObject *)v_00,auVar2._0_8_);
  bVar1 = QList<QShaderDescription::BlockVariable>::isEmpty
                    ((QList<QShaderDescription::BlockVariable> *)0x6dfdac);
  if (!bVar1) {
    local_a8 = &DAT_aaaaaaaaaaaaaaaa;
    QJsonArray::QJsonArray((QJsonArray *)&local_a8);
    local_b0.i = (BlockVariable *)&DAT_aaaaaaaaaaaaaaaa;
    local_b0 = QList<QShaderDescription::BlockVariable>::begin
                         ((QList<QShaderDescription::BlockVariable> *)in_RDI);
    local_b8.i = (BlockVariable *)&DAT_aaaaaaaaaaaaaaaa;
    local_b8 = QList<QShaderDescription::BlockVariable>::end
                         ((QList<QShaderDescription::BlockVariable> *)in_RDI);
    while( true ) {
      local_c0 = local_b8.i;
      bVar1 = QList<QShaderDescription::BlockVariable>::const_iterator::operator!=
                        (&local_b0,local_b8);
      if (!bVar1) break;
      QList<QShaderDescription::BlockVariable>::const_iterator::operator*(&local_b0);
      blockMemberObject(v_00);
      QJsonValue::QJsonValue(local_50,local_c8);
      QJsonArray::append((QJsonValue *)&local_a8);
      QJsonValue::~QJsonValue(local_50);
      QJsonObject::~QJsonObject(local_c8);
      QList<QShaderDescription::BlockVariable>::const_iterator::operator++(&local_b0);
    }
    QJsonValue::QJsonValue(local_68,(QJsonArray *)&local_a8);
    structMembersKey();
    local_d8 = QJsonObject::operator[]((QLatin1String *)pQVar4);
    QJsonValueRef::operator=((QJsonValueRef *)local_d8,local_68);
    QJsonValue::~QJsonValue(local_68);
    QJsonArray::~QJsonArray((QJsonArray *)&local_a8);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return in_RDI;
}

Assistant:

static QJsonObject inOutObject(const QShaderDescription::InOutVariable &v)
{
    QJsonObject obj;
    obj[nameKey()] = QString::fromUtf8(v.name);
    obj[typeKey()] = typeStr(v.type);
    addDeco(&obj, v);
    if (!v.structMembers.isEmpty()) {
        QJsonArray arr;
        for (const QShaderDescription::BlockVariable &sv : v.structMembers)
            arr.append(blockMemberObject(sv));
        obj[structMembersKey()] = arr;
    }
    return obj;
}